

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_output.cpp
# Opt level: O2

bool tokens_to_json(char *file_name,Lexer *lexer)

{
  string s;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  get_tokens_as_string(lexer,&local_28);
  append_content(file_name,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return true;
}

Assistant:

bool tokens_to_json(const char * file_name, Lexer & lexer)
{
  string s;
  if (!get_tokens_as_string(lexer, s))
    return false;

  append_content(file_name, s);
  return true;
}